

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O2

int __thiscall ncnn::Dequantize::forward_inplace(Dequantize *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  int i;
  void *pvVar4;
  ulong uVar5;
  int j_1;
  ulong uVar6;
  ulong uVar7;
  int j;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  Mat local_68;
  
  iVar10 = bottom_top_blob->dims;
  if (iVar10 == 3) {
    uVar2 = bottom_top_blob->c;
    uVar9 = bottom_top_blob->h * bottom_top_blob->w;
    if (this->bias_term == 0) {
      uVar5 = 0;
      uVar6 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar6 = uVar5;
      }
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar5;
      }
      while (iVar10 = (int)uVar5, iVar10 != (int)uVar7) {
        Mat::channel(&local_68,bottom_top_blob,iVar10);
        pvVar4 = local_68.data;
        Mat::~Mat(&local_68);
        Mat::channel(&local_68,bottom_top_blob,iVar10);
        pvVar3 = local_68.data;
        Mat::~Mat(&local_68);
        for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          *(float *)((long)pvVar3 + uVar5 * 4) =
               (float)*(int *)((long)pvVar4 + uVar5 * 4) * this->scale;
        }
        uVar5 = (ulong)(iVar10 + 1);
      }
    }
    else {
      uVar5 = 0;
      uVar6 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar6 = uVar5;
      }
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar5;
      }
      while (iVar10 = (int)uVar5, iVar10 != (int)uVar7) {
        Mat::channel(&local_68,bottom_top_blob,iVar10);
        pvVar4 = local_68.data;
        Mat::~Mat(&local_68);
        Mat::channel(&local_68,bottom_top_blob,iVar10);
        pvVar3 = local_68.data;
        Mat::~Mat(&local_68);
        uVar8 = 0;
        if (1 < this->bias_data_size) {
          uVar8 = uVar5;
        }
        fVar1 = *(float *)((long)(this->bias_data).data + uVar8 * 4);
        for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          *(float *)((long)pvVar3 + uVar5 * 4) =
               (float)*(int *)((long)pvVar4 + uVar5 * 4) * this->scale + fVar1;
        }
        uVar5 = (ulong)(iVar10 + 1);
      }
    }
  }
  else if (iVar10 == 2) {
    uVar2 = bottom_top_blob->w;
    uVar9 = bottom_top_blob->h;
    pvVar4 = bottom_top_blob->data;
    if (this->bias_term == 0) {
      uVar6 = 0;
      uVar5 = 0;
      if (0 < (int)uVar2) {
        uVar5 = (ulong)uVar2;
      }
      uVar7 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar7 = uVar6;
      }
      for (; uVar6 != uVar7; uVar6 = uVar6 + 1) {
        for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
          *(float *)((long)pvVar4 + uVar8 * 4) =
               (float)*(int *)((long)pvVar4 + uVar8 * 4) * this->scale;
        }
        pvVar4 = (void *)((long)pvVar4 + (long)(int)uVar2 * 4);
      }
    }
    else {
      iVar10 = this->bias_data_size;
      uVar6 = 0;
      if (0 < (int)uVar2) {
        uVar6 = (ulong)uVar2;
      }
      uVar5 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar5 = 0;
      }
      for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
        uVar8 = uVar7 & 0xffffffff;
        if (iVar10 < 2) {
          uVar8 = 0;
        }
        fVar1 = *(float *)((long)(this->bias_data).data + uVar8 * 4);
        for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          *(float *)((long)pvVar4 + uVar8 * 4) =
               (float)*(int *)((long)pvVar4 + uVar8 * 4) * this->scale + fVar1;
        }
        pvVar4 = (void *)((long)pvVar4 + (long)(int)uVar2 * 4);
      }
    }
  }
  else if (iVar10 == 1) {
    uVar2 = bottom_top_blob->w;
    pvVar4 = bottom_top_blob->data;
    if (this->bias_term == 0) {
      uVar5 = 0;
      uVar6 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar6 = uVar5;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        *(float *)((long)pvVar4 + uVar5 * 4) =
             (float)*(int *)((long)pvVar4 + uVar5 * 4) * this->scale;
      }
    }
    else if (this->bias_data_size < 2) {
      fVar1 = *(this->bias_data).data;
      uVar5 = 0;
      uVar6 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar6 = uVar5;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        *(float *)((long)pvVar4 + uVar5 * 4) =
             (float)*(int *)((long)pvVar4 + uVar5 * 4) * this->scale + fVar1;
      }
    }
    else {
      pvVar3 = (this->bias_data).data;
      uVar5 = 0;
      uVar6 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar6 = uVar5;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        *(float *)((long)pvVar4 + uVar5 * 4) =
             (float)*(int *)((long)pvVar4 + uVar5 * 4) * this->scale +
             *(float *)((long)pvVar3 + uVar5 * 4);
      }
    }
  }
  return 0;
}

Assistant:

int Dequantize::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        const int* intptr = bottom_top_blob;
        float* ptr = bottom_top_blob;

        if (bias_term)
        {
            if (bias_data_size > 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i=0; i<w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias_data[i];
                }
            }
            else
            {
                float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i=0; i<w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<w; i++)
            {
                ptr[i] = intptr[i] * scale;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const int* intptr = bottom_top_blob.row<const int>(i);
                float* ptr = bottom_top_blob.row(i);

                float bias = bias_data_size > 1 ? bias_data[i] : bias_data[0];

                for (int j=0; j<w; j++)
                {
                    ptr[j] = intptr[j] * scale + bias;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const int* intptr = bottom_top_blob.row<const int>(i);
                float* ptr = bottom_top_blob.row(i);

                for (int j=0; j<w; j++)
                {
                    ptr[j] = intptr[j] * scale;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const int* intptr = bottom_top_blob.channel(q);
                float* ptr = bottom_top_blob.channel(q);

                float bias = bias_data_size > 1 ? bias_data[q] : bias_data[0];

                for (int i=0; i<size; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const int* intptr = bottom_top_blob.channel(q);
                float* ptr = bottom_top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    ptr[i] = intptr[i] * scale;
                }
            }
        }
    }

    return 0;
}